

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::ProcessPanId
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  ErrorCode EVar1;
  pointer pbVar2;
  bool bVar3;
  uint uVar4;
  Value *pVVar5;
  char *pcVar6;
  char *pcVar7;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string *this_01;
  string_view fmt;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  uint32_t channelMask;
  uint16_t panId;
  format_string_checker<char> local_268;
  string local_230;
  Value local_210;
  CommissionerAppPtr commissioner;
  string local_1b0;
  undefined1 local_190 [40];
  Error local_168;
  undefined1 local_140 [40];
  undefined1 local_118 [40];
  undefined1 local_f0 [40];
  undefined1 local_c8 [40];
  undefined1 local_a0 [40];
  undefined1 local_78 [40];
  undefined1 local_50 [40];
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  JobManager::GetSelectedCommissioner
            ((Error *)local_f0,
             (this->mJobManager).
             super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &commissioner);
  Value::Value(&local_210,(Error *)local_f0);
  pVVar5 = Value::operator=(__return_storage_ptr__,&local_210);
  EVar1 = (pVVar5->mError).mCode;
  Value::~Value(&local_210);
  std::__cxx11::string::~string((string *)(local_f0 + 8));
  if (EVar1 != kNone) goto LAB_0011ef4f;
  pbVar2 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x21) {
    local_268._0_8_ = local_268._0_8_ & 0xffffffff00000000;
    local_268.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "too few arguments";
    local_268.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x11;
    local_268.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_268.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_268.parse_funcs_[0] = (parse_func)0x0;
    pcVar6 = "too few arguments";
    local_268.context_.types_ = local_268.types_;
    while (pcVar7 = pcVar6, pcVar7 != "") {
      pcVar6 = pcVar7 + 1;
      if (*pcVar7 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar7 + 2;
      }
      else if (*pcVar7 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",&local_268);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_268;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_230,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    this_01 = (string *)(local_50 + 8);
    local_50._0_4_ = kInvalidArgs;
    std::__cxx11::string::string(this_01,(string *)&local_230);
    Value::Value(&local_210,(Error *)local_50);
LAB_0011ef25:
    Value::operator=(__return_storage_ptr__,&local_210);
    Value::~Value(&local_210);
    std::__cxx11::string::~string(this_01);
    this_00 = &local_230;
  }
  else {
    std::__cxx11::string::string((string *)&local_210,"query",(allocator *)&local_268);
    bVar3 = CaseInsensitiveEqual(pbVar2 + 1,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    if (!bVar3) {
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string((string *)&local_210,"conflict",(allocator *)&local_268);
      bVar3 = CaseInsensitiveEqual(pbVar2 + 1,(string *)&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      if (bVar3) {
        pbVar2 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (0x40 < (ulong)((long)(aExpr->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2)) {
          utils::ParseInteger<unsigned_short>
                    ((Error *)local_190,(unsigned_short *)&channelMask,pbVar2 + 2);
          Value::Value(&local_210,(Error *)local_190);
          pVVar5 = Value::operator=(__return_storage_ptr__,&local_210);
          EVar1 = (pVVar5->mError).mCode;
          Value::~Value(&local_210);
          std::__cxx11::string::~string((string *)(local_190 + 8));
          if (EVar1 != kNone) goto LAB_0011ef4f;
          uVar4 = (*((commissioner.
                      super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0x47])
                            (commissioner.
                             super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,(ulong)(ushort)channelMask);
          std::__cxx11::to_string(&local_1b0,uVar4 & 0xff);
          Value::Value(&local_210,&local_1b0);
          Value::operator=(__return_storage_ptr__,&local_210);
          Value::~Value(&local_210);
          this_00 = &local_1b0;
          goto LAB_0011ef4a;
        }
        local_268._0_8_ = (ulong)(uint)local_268._4_4_ << 0x20;
        local_268.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "too few arguments";
        local_268.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x11;
        local_268.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
        local_268.context_.super_basic_format_parse_context<char>._20_4_ = 0;
        local_268.parse_funcs_[0] = (parse_func)0x0;
        pcVar6 = "too few arguments";
        local_268.context_.types_ = local_268.types_;
        while (pcVar7 = pcVar6, pcVar7 != "") {
          pcVar6 = pcVar7 + 1;
          if (*pcVar7 == '}') {
            if ((pcVar6 == "") || (*pcVar6 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar6 = pcVar7 + 2;
          }
          else if (*pcVar7 == '{') {
            pcVar6 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                               (pcVar7,"",&local_268);
          }
        }
        args_02.field_1.values_ = in_R9.values_;
        args_02.desc_ = (unsigned_long_long)&local_268;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_230,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_02);
        this_01 = (string *)(local_a0 + 8);
        local_a0._0_4_ = kInvalidArgs;
        std::__cxx11::string::string(this_01,(string *)&local_230);
        Value::Value(&local_210,(Error *)local_a0);
      }
      else {
        local_268.types_[0] = string_type;
        local_268.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "\'{}\' is not a valid sub-command";
        local_268.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1f;
        local_268.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
        local_268.context_.super_basic_format_parse_context<char>._20_4_ = 1;
        local_268.parse_funcs_[0] =
             ::fmt::v10::detail::
             parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
        pcVar6 = "\'{}\' is not a valid sub-command";
        local_268.context_.types_ = local_268.types_;
        while (pcVar7 = pcVar6, pcVar7 != "") {
          pcVar6 = pcVar7 + 1;
          if (*pcVar7 == '}') {
            if ((pcVar6 == "") || (*pcVar6 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar6 = pcVar7 + 2;
          }
          else if (*pcVar7 == '{') {
            pcVar6 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                               (pcVar7,"",&local_268);
          }
        }
        pbVar2 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_268._0_8_ = pbVar2[1]._M_dataplus._M_p;
        local_268.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             (char *)pbVar2[1]._M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x1f;
        args_01.field_1.values_ = in_R9.values_;
        args_01.desc_ = (unsigned_long_long)&local_268;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_230,(v10 *)"\'{}\' is not a valid sub-command",fmt,args_01);
        this_01 = (string *)(local_c8 + 8);
        local_c8._0_4_ = kInvalidCommand;
        std::__cxx11::string::string(this_01,(string *)&local_230);
        Value::Value(&local_210,(Error *)local_c8);
      }
      goto LAB_0011ef25;
    }
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(aExpr->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x81) {
      local_268._0_8_ = local_268._0_8_ & 0xffffffff00000000;
      local_268.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "too few arguments";
      local_268.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x11;
      local_268.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_268.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_268.parse_funcs_[0] = (parse_func)0x0;
      pcVar6 = "too few arguments";
      local_268.context_.types_ = local_268.types_;
      while (pcVar7 = pcVar6, pcVar7 != "") {
        pcVar6 = pcVar7 + 1;
        if (*pcVar7 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar7 + 2;
        }
        else if (*pcVar7 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar7,"",&local_268);
        }
      }
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_268;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_230,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_00);
      this_01 = (string *)(local_78 + 8);
      local_78._0_4_ = kInvalidArgs;
      std::__cxx11::string::string(this_01,(string *)&local_230);
      Value::Value(&local_210,(Error *)local_78);
      goto LAB_0011ef25;
    }
    utils::ParseInteger<unsigned_int>((Error *)local_118,&channelMask,pbVar2 + 2);
    Value::Value(&local_210,(Error *)local_118);
    pVVar5 = Value::operator=(__return_storage_ptr__,&local_210);
    EVar1 = (pVVar5->mError).mCode;
    Value::~Value(&local_210);
    std::__cxx11::string::~string((string *)(local_118 + 8));
    if (EVar1 != kNone) goto LAB_0011ef4f;
    utils::ParseInteger<unsigned_short>
              ((Error *)local_140,&panId,
               (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 3);
    Value::Value(&local_210,(Error *)local_140);
    pVVar5 = Value::operator=(__return_storage_ptr__,&local_210);
    EVar1 = (pVVar5->mError).mCode;
    Value::~Value(&local_210);
    std::__cxx11::string::~string((string *)(local_140 + 8));
    if (EVar1 != kNone) goto LAB_0011ef4f;
    (*((commissioner.
        super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_CommissionerHandler)._vptr_CommissionerHandler[0x46])
              (&local_168,
               commissioner.
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(ulong)channelMask,(ulong)panId,
               (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 4);
    Value::Value(&local_210,&local_168);
    Value::operator=(__return_storage_ptr__,&local_210);
    Value::~Value(&local_210);
    this_00 = &local_168.mMessage;
  }
LAB_0011ef4a:
  std::__cxx11::string::~string((string *)this_00);
LAB_0011ef4f:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&commissioner.
              super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessPanId(const Expression &aExpr)
{
    Value              value;
    CommissionerAppPtr commissioner = nullptr;

    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));

    if (CaseInsensitiveEqual(aExpr[1], "query"))
    {
        uint32_t channelMask;
        uint16_t panId;
        VerifyOrExit(aExpr.size() >= 5, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = ParseInteger(channelMask, aExpr[2]));
        SuccessOrExit(value = ParseInteger(panId, aExpr[3]));
        SuccessOrExit(value = commissioner->PanIdQuery(channelMask, panId, aExpr[4]));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "conflict"))
    {
        uint16_t panId;
        bool     conflict;
        VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = ParseInteger(panId, aExpr[2]));
        conflict = commissioner->HasPanIdConflict(panId);
        value    = std::to_string(conflict);
    }
    else
    {
        value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]);
    }

exit:
    return value;
}